

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

uint64_t flatbuffers::anon_unknown_0::HashFile(char *source_filename,char *source)

{
  char *input;
  unsigned_long uVar1;
  allocator<char> local_61;
  string local_60;
  string local_40;
  unsigned_long local_20;
  uint64_t hash;
  char *source_local;
  char *source_filename_local;
  
  local_20 = 0;
  hash = (uint64_t)source;
  source_local = source_filename;
  if (source_filename != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,source_filename,&local_61);
    StripPath(&local_40,&local_60);
    input = (char *)std::__cxx11::string::c_str();
    local_20 = HashFnv1a<unsigned_long>(input);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  if ((hash != 0) && (*(char *)hash != '\0')) {
    uVar1 = HashFnv1a<unsigned_long>((char *)hash);
    local_20 = uVar1 ^ local_20;
  }
  return local_20;
}

Assistant:

static uint64_t HashFile(const char *source_filename, const char *source) {
  uint64_t hash = 0;

  if (source_filename)
    hash = HashFnv1a<uint64_t>(StripPath(source_filename).c_str());

  if (source && *source) hash ^= HashFnv1a<uint64_t>(source);

  return hash;
}